

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# moc_QFileSystemComboBox.cpp
# Opt level: O1

void QFileSystemComboBox::qt_static_metacall(QObject *_o,Call _c,int _id,void **_a)

{
  QStringList *nameFilters;
  Section *pSVar1;
  undefined4 *puVar2;
  code *pcVar3;
  long lVar4;
  undefined8 *puVar5;
  undefined8 uVar6;
  Data *pDVar7;
  QString *pQVar8;
  qsizetype qVar9;
  bool bVar10;
  Filters FVar11;
  int iVar12;
  QArrayDataPointer<QString> local_48;
  QArrayDataPointer<QString> local_28;
  
  switch(_c) {
  case InvokeMetaMethod:
    switch(_id) {
    case 0:
      local_48.ptr = (QString *)_a[1];
      iVar12 = 0;
      break;
    case 1:
      local_48.ptr = (QString *)_a[1];
      iVar12 = 1;
      break;
    case 2:
      currentFileNameChanged((QString *)&local_48,(QFileSystemComboBox *)_o,(QString *)_a[1]);
      goto LAB_00168f8b;
    case 3:
      currentFilePathChanged((QString *)&local_48,(QFileSystemComboBox *)_o,(QString *)_a[1]);
LAB_00168f8b:
      puVar5 = (undefined8 *)*_a;
      if (puVar5 != (undefined8 *)0x0) {
        pDVar7 = (Data *)*puVar5;
        pQVar8 = (QString *)puVar5[1];
        *puVar5 = local_48.d;
        puVar5[1] = local_48.ptr;
        uVar6 = puVar5[2];
        puVar5[2] = local_48.size;
        local_48.d = pDVar7;
        local_48.ptr = pQVar8;
        local_48.size = uVar6;
      }
LAB_00169157:
      QArrayDataPointer<char16_t>::~QArrayDataPointer((QArrayDataPointer<char16_t> *)&local_48);
    default:
      goto switchD_00168e70_caseD_3;
    }
    local_48.d = (Data *)0x0;
    QMetaObject::activate(_o,&staticMetaObject,iVar12,&local_48.d);
    break;
  case ReadProperty:
    if (7 < (uint)_id) {
      return;
    }
    pSVar1 = (Section *)*_a;
    switch(_id) {
    case 0:
      bVar10 = nameFilterDisables((QFileSystemComboBox *)_o);
      goto LAB_0016910c;
    case 1:
      bVar10 = resolveSymlinks((QFileSystemComboBox *)_o);
LAB_0016910c:
      *(bool *)pSVar1 = bVar10;
      return;
    case 2:
      FVar11 = filters((QFileSystemComboBox *)_o);
      goto LAB_0016906e;
    case 3:
      QFileSystemComboBox::nameFilters((QStringList *)&local_28,(QFileSystemComboBox *)_o);
      qVar9 = local_28.size;
      pQVar8 = local_28.ptr;
      pDVar7 = local_28.d;
      local_28.d = (Data *)0x0;
      local_28.ptr = (QString *)0x0;
      local_28.size = 0;
      local_48.d = *(Data **)pSVar1;
      local_48.ptr = *(QString **)(pSVar1 + 2);
      *(Data **)pSVar1 = pDVar7;
      *(QString **)(pSVar1 + 2) = pQVar8;
      local_48.size = *(qsizetype *)(pSVar1 + 4);
      *(qsizetype *)(pSVar1 + 4) = qVar9;
      QArrayDataPointer<QString>::~QArrayDataPointer(&local_48);
      QArrayDataPointer<QString>::~QArrayDataPointer(&local_28);
      return;
    case 4:
      FVar11.i = visibleSection((QFileSystemComboBox *)_o);
LAB_0016906e:
      *pSVar1 = FVar11.i;
      return;
    case 5:
      rootPath((QString *)&local_48,(QFileSystemComboBox *)_o);
      break;
    case 6:
      currentFileName((QString *)&local_48,(QFileSystemComboBox *)_o);
      break;
    case 7:
      currentFilePath((QString *)&local_48,(QFileSystemComboBox *)_o);
    }
    pDVar7 = *(Data **)pSVar1;
    pQVar8 = *(QString **)(pSVar1 + 2);
    *(Data **)pSVar1 = local_48.d;
    *(QString **)(pSVar1 + 2) = local_48.ptr;
    uVar6 = *(undefined8 *)(pSVar1 + 4);
    *(qsizetype *)(pSVar1 + 4) = local_48.size;
    local_48.d = pDVar7;
    local_48.ptr = pQVar8;
    local_48.size = uVar6;
    goto LAB_00169157;
  case WriteProperty:
    if ((uint)_id < 8) {
      nameFilters = (QStringList *)*_a;
      switch(_id) {
      case 0:
        setNameFilterDisables((QFileSystemComboBox *)_o,*(bool *)&(nameFilters->d).d);
        return;
      case 1:
        setResolveSymlinks((QFileSystemComboBox *)_o,*(bool *)&(nameFilters->d).d);
        return;
      case 2:
        setFilters((QFileSystemComboBox *)_o,(Filters)*(Int *)&(nameFilters->d).d);
        return;
      case 3:
        setNameFilters((QFileSystemComboBox *)_o,nameFilters);
        return;
      case 4:
        setVisibleSection((QFileSystemComboBox *)_o,*(Section *)&(nameFilters->d).d);
        return;
      case 5:
        setRootPath((QFileSystemComboBox *)_o,(QString *)nameFilters);
        return;
      case 6:
        setCurrentFileName((QFileSystemComboBox *)_o,(QString *)nameFilters);
        return;
      case 7:
        setCurrentFilePath((QFileSystemComboBox *)_o,(QString *)nameFilters);
        return;
      }
    }
    break;
  case IndexOfMethod:
    puVar2 = (undefined4 *)*_a;
    pcVar3 = *_a[1];
    lVar4 = *(long *)((long)_a[1] + 8);
    if (pcVar3 == directoryLoaded && lVar4 == 0) {
      *puVar2 = 0;
    }
    else if (pcVar3 == rootPathChanged && lVar4 == 0) {
      *puVar2 = 1;
    }
    else if (pcVar3 == currentFileNameChanged && lVar4 == 0) {
      *puVar2 = 2;
    }
    else if (pcVar3 == currentFilePathChanged && lVar4 == 0) {
      *puVar2 = 3;
    }
  }
switchD_00168e70_caseD_3:
  return;
}

Assistant:

void QFileSystemComboBox::qt_static_metacall(QObject *_o, QMetaObject::Call _c, int _id, void **_a)
{
    if (_c == QMetaObject::InvokeMetaMethod) {
        auto *_t = static_cast<QFileSystemComboBox *>(_o);
        (void)_t;
        switch (_id) {
        case 0: _t->directoryLoaded((*reinterpret_cast< std::add_pointer_t<QString>>(_a[1]))); break;
        case 1: _t->rootPathChanged((*reinterpret_cast< std::add_pointer_t<QString>>(_a[1]))); break;
        case 2: { QString _r = _t->currentFileNameChanged((*reinterpret_cast< std::add_pointer_t<QString>>(_a[1])));
            if (_a[0]) *reinterpret_cast< QString*>(_a[0]) = std::move(_r); }  break;
        case 3: { QString _r = _t->currentFilePathChanged((*reinterpret_cast< std::add_pointer_t<QString>>(_a[1])));
            if (_a[0]) *reinterpret_cast< QString*>(_a[0]) = std::move(_r); }  break;
        default: ;
        }
    } else if (_c == QMetaObject::IndexOfMethod) {
        int *result = reinterpret_cast<int *>(_a[0]);
        {
            using _t = void (QFileSystemComboBox::*)(const QString & );
            if (*reinterpret_cast<_t *>(_a[1]) == static_cast<_t>(&QFileSystemComboBox::directoryLoaded)) {
                *result = 0;
                return;
            }
        }
        {
            using _t = void (QFileSystemComboBox::*)(const QString & );
            if (*reinterpret_cast<_t *>(_a[1]) == static_cast<_t>(&QFileSystemComboBox::rootPathChanged)) {
                *result = 1;
                return;
            }
        }
        {
            using _t = QString (QFileSystemComboBox::*)(const QString & );
            if (*reinterpret_cast<_t *>(_a[1]) == static_cast<_t>(&QFileSystemComboBox::currentFileNameChanged)) {
                *result = 2;
                return;
            }
        }
        {
            using _t = QString (QFileSystemComboBox::*)(const QString & );
            if (*reinterpret_cast<_t *>(_a[1]) == static_cast<_t>(&QFileSystemComboBox::currentFilePathChanged)) {
                *result = 3;
                return;
            }
        }
    }
#ifndef QT_NO_PROPERTIES
    else if (_c == QMetaObject::ReadProperty) {
        auto *_t = static_cast<QFileSystemComboBox *>(_o);
        (void)_t;
        void *_v = _a[0];
        switch (_id) {
        case 0: *reinterpret_cast< bool*>(_v) = _t->nameFilterDisables(); break;
        case 1: *reinterpret_cast< bool*>(_v) = _t->resolveSymlinks(); break;
        case 2: *reinterpret_cast< QDir::Filters*>(_v) = _t->filters(); break;
        case 3: *reinterpret_cast< QStringList*>(_v) = _t->nameFilters(); break;
        case 4: *reinterpret_cast< QFileSystemComboBox::Section*>(_v) = _t->visibleSection(); break;
        case 5: *reinterpret_cast< QString*>(_v) = _t->rootPath(); break;
        case 6: *reinterpret_cast< QString*>(_v) = _t->currentFileName(); break;
        case 7: *reinterpret_cast< QString*>(_v) = _t->currentFilePath(); break;
        default: break;
        }
    } else if (_c == QMetaObject::WriteProperty) {
        auto *_t = static_cast<QFileSystemComboBox *>(_o);
        (void)_t;
        void *_v = _a[0];
        switch (_id) {
        case 0: _t->setNameFilterDisables(*reinterpret_cast< bool*>(_v)); break;
        case 1: _t->setResolveSymlinks(*reinterpret_cast< bool*>(_v)); break;
        case 2: _t->setFilters(*reinterpret_cast< QDir::Filters*>(_v)); break;
        case 3: _t->setNameFilters(*reinterpret_cast< QStringList*>(_v)); break;
        case 4: _t->setVisibleSection(*reinterpret_cast< QFileSystemComboBox::Section*>(_v)); break;
        case 5: _t->setRootPath(*reinterpret_cast< QString*>(_v)); break;
        case 6: _t->setCurrentFileName(*reinterpret_cast< QString*>(_v)); break;
        case 7: _t->setCurrentFilePath(*reinterpret_cast< QString*>(_v)); break;
        default: break;
        }
    } else if (_c == QMetaObject::ResetProperty) {
    } else if (_c == QMetaObject::BindableProperty) {
    }
#endif // QT_NO_PROPERTIES
}